

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void retstat(LexState *ls)

{
  int iVar1;
  int local_38;
  uint local_34;
  int nret;
  int first;
  expdesc e;
  FuncState *fs;
  LexState *ls_local;
  
  e._16_8_ = ls->fs;
  iVar1 = block_follow(ls,1);
  if ((iVar1 == 0) && ((ls->t).token != 0x3b)) {
    local_38 = explist(ls,(expdesc *)&nret);
    if ((nret == 0xd) || (nret == 0xe)) {
      luaK_setreturns((FuncState *)e._16_8_,(expdesc *)&nret,-1);
      if ((nret == 0xd) && (local_38 == 1)) {
        *(uint *)(*(long *)(*(long *)e._16_8_ + 0x38) + (long)(int)e.k * 4) =
             *(uint *)(*(long *)(*(long *)e._16_8_ + 0x38) + (long)(int)e.k * 4) & 0xffffffc0 | 0x25
        ;
      }
      local_34 = (uint)*(byte *)(e._16_8_ + 0x3a);
      local_38 = -1;
    }
    else if (local_38 == 1) {
      local_34 = luaK_exp2anyreg((FuncState *)e._16_8_,(expdesc *)&nret);
    }
    else {
      luaK_exp2nextreg((FuncState *)e._16_8_,(expdesc *)&nret);
      local_34 = (uint)*(byte *)(e._16_8_ + 0x3a);
    }
  }
  else {
    local_38 = 0;
    local_34 = 0;
  }
  luaK_ret((FuncState *)e._16_8_,local_34,local_38);
  testnext(ls,0x3b);
  return;
}

Assistant:

static void retstat (LexState *ls) {
  /* stat -> RETURN [explist] [';'] */
  FuncState *fs = ls->fs;
  expdesc e;
  int first, nret;  /* registers with returned values */
  if (block_follow(ls, 1) || ls->t.token == ';')
    first = nret = 0;  /* return no values */
  else {
    nret = explist(ls, &e);  /* optional return values */
    if (hasmultret(e.k)) {
      luaK_setmultret(fs, &e);
      if (e.k == VCALL && nret == 1) {  /* tail call? */
        SET_OPCODE(getinstruction(fs,&e), OP_TAILCALL);
        lua_assert(GETARG_A(getinstruction(fs,&e)) == fs->nactvar);
      }
      first = fs->nactvar;
      nret = LUA_MULTRET;  /* return all values */
    }
    else {
      if (nret == 1)  /* only one single value? */
        first = luaK_exp2anyreg(fs, &e);
      else {
        luaK_exp2nextreg(fs, &e);  /* values must go to the stack */
        first = fs->nactvar;  /* return all active values */
        lua_assert(nret == fs->freereg - first);
      }
    }
  }
  luaK_ret(fs, first, nret);
  testnext(ls, ';');  /* skip optional semicolon */
}